

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

int linear_expansion_sum(int elen,double *e,int flen,double *f,double *h)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar12 = *e;
  dVar11 = *f;
  bVar8 = dVar12 < dVar11 == dVar11 <= -dVar12;
  if (bVar8) {
    dVar10 = f[1];
    dVar9 = dVar12;
  }
  else {
    dVar9 = e[1];
    dVar10 = dVar11;
    dVar11 = dVar12;
  }
  uVar4 = (ulong)!bVar8;
  uVar2 = (ulong)bVar8;
  uVar5 = (uint)!bVar8;
  if (((int)uVar5 < elen) && ((flen <= (int)(uint)bVar8 || (dVar9 < dVar10 != dVar10 <= -dVar9)))) {
    dVar12 = dVar9 + dVar11;
    dVar13 = dVar12 - dVar9;
    uVar4 = (ulong)(uVar5 + 1);
    dVar9 = e[uVar4];
  }
  else {
    dVar12 = dVar10 + dVar11;
    dVar13 = dVar12 - dVar10;
    uVar2 = (ulong)(bVar8 + 1);
    dVar10 = f[uVar2];
  }
  dVar11 = dVar11 - dVar13;
  uVar5 = (elen + flen) - 2;
  uVar7 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    iVar3 = (int)uVar4;
    iVar1 = (int)uVar2;
    if ((iVar3 < elen) && ((flen <= iVar1 || (dVar9 < dVar10 != dVar10 <= -dVar9)))) {
      dVar13 = dVar11 + dVar9;
      h[uVar7] = dVar11 - (dVar13 - dVar9);
      uVar4 = (ulong)(iVar3 + 1);
      dVar9 = e[(long)iVar3 + 1];
    }
    else {
      dVar13 = dVar11 + dVar10;
      h[uVar7] = dVar11 - (dVar13 - dVar10);
      uVar2 = (ulong)(iVar1 + 1);
      dVar10 = f[(long)iVar1 + 1];
    }
    dVar14 = dVar12 + dVar13;
    dVar11 = (dVar12 - (dVar14 - (dVar14 - dVar12))) + (dVar13 - (dVar14 - dVar12));
    dVar12 = dVar14;
  }
  h[uVar6] = dVar11;
  h[uVar6 + 1] = dVar12;
  return (int)uVar6 + 2;
}

Assistant:

int linear_expansion_sum(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* h cannot be e or f. */
{
  REAL Q, q;
  INEXACT REAL Qnew;
  INEXACT REAL R;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  REAL enow, fnow;
  REAL g0;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    g0 = enow;
    enow = e[++eindex];
  } else {
    g0 = fnow;
    fnow = f[++findex];
  }
  if ((eindex < elen) && ((findex >= flen)
                          || ((fnow > enow) == (fnow > -enow)))) {
    Fast_Two_Sum(enow, g0, Qnew, q);
    enow = e[++eindex];
  } else {
    Fast_Two_Sum(fnow, g0, Qnew, q);
    fnow = f[++findex];
  }
  Q = Qnew;
  for (hindex = 0; hindex < elen + flen - 2; hindex++) {
    if ((eindex < elen) && ((findex >= flen)
                            || ((fnow > enow) == (fnow > -enow)))) {
      Fast_Two_Sum(enow, q, R, h[hindex]);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, q, R, h[hindex]);
      fnow = f[++findex];
    }
    Two_Sum(Q, R, Qnew, q);
    Q = Qnew;
  }
  h[hindex] = q;
  h[hindex + 1] = Q;
  return hindex + 2;
}